

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O1

DdNode * Llb_NonlinImageCompute(DdNode *bCurrent,int fReorder,int fDrop,int fVerbose,int *pOrder)

{
  Llb_Prt_t *pPart;
  Llb_Mgr_t *pLVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  DdNode *n;
  long lVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  DdNode *f;
  int iVar10;
  timespec ts;
  Llb_Prt_t *pPart2;
  Llb_Prt_t *pPart1;
  timespec local_58;
  Llb_Prt_t *local_48;
  Llb_Prt_t *local_40;
  long local_38;
  
  iVar2 = clock_gettime(3,&local_58);
  pLVar1 = p;
  if (iVar2 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_58.tv_sec * -1000000;
  }
  iVar2 = p->iPartFree;
  p->iPartFree = iVar2 + 1;
  Llb_NonlinAddPartition(pLVar1,iVar2,bCurrent);
  if (0 < p->iPartFree) {
    lVar6 = 0;
    do {
      pPart = p->pParts[lVar6];
      if (pPart != (Llb_Prt_t *)0x0) {
        lVar4 = (long)pPart->vVars->nSize;
        if (0 < lVar4) {
          lVar7 = 0;
          do {
            if (p->pVars[pPart->vVars->pArray[lVar7]]->vParts->nSize == 1) {
              Llb_NonlinQuantify1(p,pPart,0);
              break;
            }
            lVar7 = lVar7 + 1;
          } while (lVar4 != lVar7);
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < p->iPartFree);
  }
  if (fReorder != 0) {
    Llb_NonlinReorder(p->dd,0,0);
  }
  pLVar1 = p;
  memcpy(pOrder,p->dd->invperm,(long)p->dd->size << 2);
  Llb_NonlinRecomputeScores(pLVar1);
  iVar2 = Llb_NonlinNextPartitions(p,&local_40,&local_48);
  uVar9 = 0;
  if (iVar2 != 0) {
    do {
      local_38 = lVar5;
      iVar2 = clock_gettime(3,&local_58);
      if (iVar2 < 0) {
        lVar5 = -1;
      }
      else {
        lVar5 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
      }
      iVar2 = Cudd_ReadReorderings(p->dd);
      iVar3 = Llb_NonlinQuantify2(p,local_40,local_48);
      if (iVar3 == 0) goto LAB_007d90d1;
      iVar3 = clock_gettime(3,&local_58);
      iVar10 = -1;
      lVar6 = -1;
      if (-1 < iVar3) {
        lVar6 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
      }
      timeAndEx = timeAndEx + (lVar6 - lVar5);
      iVar3 = clock_gettime(3,&local_58);
      if (-1 < iVar3) {
        iVar10 = (int)(local_58.tv_nsec / 1000) + (int)local_58.tv_sec * 1000000;
      }
      iVar3 = Cudd_ReadReorderings(p->dd);
      if (iVar2 < iVar3) {
        Llb_NonlinRecomputeScores(p);
      }
      uVar8 = (int)uVar9 + (iVar10 - (int)lVar5);
      uVar9 = (ulong)uVar8;
      iVar2 = Llb_NonlinNextPartitions(p,&local_40,&local_48);
      lVar5 = local_38;
    } while (iVar2 != 0);
    uVar9 = (ulong)(int)uVar8;
  }
  n = Cudd_ReadOne(p->dd);
  Cudd_Ref(n);
  if (0 < p->iPartFree) {
    lVar6 = 0;
    f = n;
    do {
      n = f;
      if (p->pParts[lVar6] != (Llb_Prt_t *)0x0) {
        n = Cudd_bddAnd(p->dd,f,p->pParts[lVar6]->bFunc);
        if (n == (DdNode *)0x0) {
          Cudd_RecursiveDeref(p->dd,f);
LAB_007d90d1:
          Llb_NonlinFree(p);
          return (DdNode *)0x0;
        }
        Cudd_Ref(n);
        Cudd_RecursiveDeref(p->dd,f);
      }
      lVar6 = lVar6 + 1;
      f = n;
    } while (lVar6 < p->iPartFree);
  }
  nSuppMax = p->nSuppMax;
  iVar2 = clock_gettime(3,&local_58);
  if (iVar2 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
  }
  timeOther = timeOther + (lVar5 - uVar9) + lVar6;
  Cudd_Deref(n);
  return n;
}

Assistant:

DdNode * Llb_NonlinImageCompute( DdNode * bCurrent, int fReorder, int fDrop, int fVerbose, int * pOrder )
{
    Llb_Prt_t * pPart, * pPart1, * pPart2;
    DdNode * bFunc, * bTemp;
    int i, nReorders, timeInside = 0;
    abctime clk = Abc_Clock(), clk2;

    // add partition
    Llb_NonlinAddPartition( p, p->iPartFree++, bCurrent );
    // remove singles
    Llb_MgrForEachPart( p, pPart, i )
        if ( Llb_NonlinHasSingletonVars(p, pPart) )
            Llb_NonlinQuantify1( p, pPart, 0 );
    // reorder
    if ( fReorder )
        Llb_NonlinReorder( p->dd, 0, 0 );
    // save permutation
    memcpy( pOrder, p->dd->invperm, sizeof(int) * p->dd->size );

    // compute scores
    Llb_NonlinRecomputeScores( p );
    // iteratively quantify variables
    while ( Llb_NonlinNextPartitions(p, &pPart1, &pPart2) )
    {
        clk2 = Abc_Clock();
        nReorders = Cudd_ReadReorderings(p->dd);
        if ( !Llb_NonlinQuantify2( p, pPart1, pPart2 ) )
        {
            Llb_NonlinFree( p );
            return NULL;
        }
        timeAndEx  += Abc_Clock() - clk2;
        timeInside += Abc_Clock() - clk2;
        if ( nReorders < Cudd_ReadReorderings(p->dd) )
            Llb_NonlinRecomputeScores( p );
//        else
//            Llb_NonlinVerifyScores( p );
    }
    // load partitions
    bFunc = Cudd_ReadOne(p->dd);   Cudd_Ref( bFunc );
    Llb_MgrForEachPart( p, pPart, i )
    {
        bFunc = Cudd_bddAnd( p->dd, bTemp = bFunc, pPart->bFunc );
        if ( bFunc == NULL )
        {
            Cudd_RecursiveDeref( p->dd, bTemp );
            Llb_NonlinFree( p );
            return NULL;
        }
        Cudd_Ref( bFunc );
        Cudd_RecursiveDeref( p->dd, bTemp );
    }
    nSuppMax = p->nSuppMax;
    // reorder variables
//    if ( fReorder )
//        Llb_NonlinReorder( p->dd, 0, fVerbose );
    // save permutation
//    memcpy( pOrder, p->dd->invperm, sizeof(int) * Cudd_ReadSize(p->dd) );

    timeOther += Abc_Clock() - clk - timeInside;
    // return
    Cudd_Deref( bFunc );
    return bFunc;
}